

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_compress_tile
              (fitsfile *outfptr,long row,int datatype,void *tiledata,long tilelen,long tilenx,
              long tileny,int nullcheck,void *nullflagval,int *status)

{
  float fVar1;
  short *lldst;
  long lVar2;
  ulong uVar3;
  char *inmemptr;
  double *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  double *in_R9;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int in_stack_00000010;
  double *in_stack_00000018;
  long *in_stack_00000020;
  LONGLONG *lldata;
  long hcomp_len;
  double bzero [1];
  double bscale [1];
  double noise5;
  double noise3;
  double noise2;
  float hcompscale;
  int ihcompscale;
  uint bzlen;
  size_t gzip_nelem;
  int tilecol;
  int nelem;
  short *cbuf;
  size_t clen;
  long ii;
  double actual_bzero;
  double zero;
  double scale;
  int intlength;
  int flag;
  int nullval;
  int zbitpix;
  int cn_zblank;
  int *idata;
  double *in_stack_00007120;
  LONGLONG in_stack_00007128;
  uchar *in_stack_00007130;
  LONGLONG in_stack_00007138;
  undefined4 in_stack_00007140;
  int in_stack_00007144;
  fitsfile *in_stack_00007148;
  int in_stack_00007154;
  fitsfile *in_stack_00007158;
  int *in_stack_00007190;
  int *in_stack_000071a0;
  undefined8 in_stack_fffffffffffffe98;
  undefined4 uVar7;
  double *pdVar8;
  long in_stack_fffffffffffffea8;
  undefined4 uVar10;
  long *plVar9;
  int *in_stack_fffffffffffffeb0;
  undefined4 uVar11;
  LONGLONG *in_stack_fffffffffffffeb8;
  fitsfile *in_stack_fffffffffffffec0;
  fitsfile *in_stack_fffffffffffffec8;
  int *in_stack_fffffffffffffed0;
  int iVar12;
  long *in_stack_fffffffffffffed8;
  int *in_stack_fffffffffffffee0;
  int iVar13;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  fitsfile *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  long *ngoodpix;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  fitsfile *outfptr_00;
  int in_stack_ffffffffffffff40;
  undefined4 uVar14;
  int *minvalue;
  int *in_stack_ffffffffffffff58;
  long lVar15;
  double *mean;
  double *sigma;
  double *noise1;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int iVar16;
  undefined4 uVar17;
  int iVar18;
  int iVar19;
  double *pdVar20;
  int local_34;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  iVar16 = 1;
  uVar14 = 0;
  outfptr_00 = (fitsfile *)0x0;
  ngoodpix = (long *)0x3ff0000000000000;
  memset(&stack0xffffffffffffff00,0,8);
  if ((int)*in_stack_00000020 < 1) {
    fVar1 = *(float *)(*(long *)(in_RDI + 8) + 0x470);
    if (((((fVar1 != 9999.0) || (NAN(fVar1))) || (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x15))
        || (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x16)) ||
       (((in_EDX != 0x2a && (1 < in_EDX - 0x52U)) &&
        (in_stack_fffffffffffffeec = in_EDX, in_EDX != 0xa3)))) {
      if (*(long *)(*(long *)(in_RDI + 8) + 0x530) != 0) {
        in_stack_fffffffffffffee0 = (int *)(in_RSI + -1);
        in_stack_ffffffffffffff40 =
             (int)((long)in_stack_fffffffffffffee0 %
                  ((*(long *)(*(long *)(in_RDI + 8) + 0x498) + -1) /
                   *(long *)(*(long *)(in_RDI + 8) + 0x440) + 1));
        if (*(int *)(*(long *)(*(long *)(in_RDI + 8) + 0x530) + (long)in_stack_ffffffffffffff40 * 4)
            == in_RSI) {
          if (*(long *)(*(long *)(*(long *)(in_RDI + 8) + 0x548) +
                       (long)in_stack_ffffffffffffff40 * 8) != 0) {
            free(*(void **)(*(long *)(*(long *)(in_RDI + 8) + 0x548) +
                           (long)in_stack_ffffffffffffff40 * 8));
          }
          if (*(long *)(*(long *)(*(long *)(in_RDI + 8) + 0x550) +
                       (long)in_stack_ffffffffffffff40 * 8) != 0) {
            free(*(void **)(*(long *)(*(long *)(in_RDI + 8) + 0x550) +
                           (long)in_stack_ffffffffffffff40 * 8));
          }
          *(undefined8 *)
           (*(long *)(*(long *)(in_RDI + 8) + 0x548) + (long)in_stack_ffffffffffffff40 * 8) = 0;
          *(undefined8 *)
           (*(long *)(*(long *)(in_RDI + 8) + 0x550) + (long)in_stack_ffffffffffffff40 * 8) = 0;
          *(undefined4 *)
           (*(long *)(*(long *)(in_RDI + 8) + 0x530) + (long)in_stack_ffffffffffffff40 * 4) = 0;
          *(undefined8 *)
           (*(long *)(*(long *)(in_RDI + 8) + 0x538) + (long)in_stack_ffffffffffffff40 * 8) = 0;
          *(undefined4 *)
           (*(long *)(*(long *)(in_RDI + 8) + 0x540) + (long)in_stack_ffffffffffffff40 * 4) = 0;
          *(undefined4 *)
           (*(long *)(*(long *)(in_RDI + 8) + 0x558) + (long)in_stack_ffffffffffffff40 * 4) = 0;
        }
      }
      if (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == -1) {
        iVar16 = imcomp_write_nocompress_tile
                           (in_stack_fffffffffffffec8,(long)in_stack_fffffffffffffec0,
                            (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                            in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                            (int)((ulong)in_stack_00000020 >> 0x20),in_stack_fffffffffffffee0,
                            (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        if (iVar16 < 1) {
          local_34 = (int)*in_stack_00000020;
        }
        else {
          local_34 = (int)*in_stack_00000020;
        }
      }
      else {
        iVar18 = *(int *)(*(long *)(in_RDI + 8) + 0x48c);
        iVar19 = *(int *)(*(long *)(in_RDI + 8) + 0x4ec);
        uVar17 = *(undefined4 *)(*(long *)(in_RDI + 8) + 0x518);
        if ((0 < iVar18) && (iVar19 != -1)) {
          in_stack_00000010 = 0;
        }
        noise1 = *(double **)(*(long *)(in_RDI + 8) + 0x500);
        sigma = *(double **)(*(long *)(in_RDI + 8) + 0x508);
        mean = *(double **)(*(long *)(in_RDI + 8) + 0x510);
        iVar12 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
        iVar13 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
        plVar9 = in_stack_00000020;
        pdVar20 = in_RCX;
        if (in_EDX == 0x15) {
          pdVar8 = (double *)&stack0xffffffffffffff7c;
          lVar15 = CONCAT44(uVar7,iVar18);
          imcomp_convert_tile_tshort
                    (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),iVar13,
                     in_stack_fffffffffffffed8,iVar12,in_stack_ffffffffffffff10,
                     (double)in_stack_fffffffffffffec8,(double)in_stack_fffffffffffffec0,
                     (double)in_stack_fffffffffffffeb8,in_stack_ffffffffffffff18,
                     (int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          iVar12 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
        }
        else if (in_EDX == 0x14) {
          pdVar8 = (double *)&stack0xffffffffffffff7c;
          lVar15 = CONCAT44(uVar7,iVar18);
          imcomp_convert_tile_tushort
                    (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),iVar13,
                     in_stack_fffffffffffffed8,iVar12,in_stack_ffffffffffffff10,
                     (double)in_stack_fffffffffffffec8,(double)in_stack_fffffffffffffec0,
                     in_stack_ffffffffffffff18,
                     (int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          iVar12 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
        }
        else {
          iVar13 = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
          if (in_EDX == 0xb) {
            pdVar8 = (double *)&stack0xffffffffffffff7c;
            lVar15 = CONCAT44(uVar7,iVar18);
            imcomp_convert_tile_tbyte
                      ((fitsfile *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       in_stack_fffffffffffffee0,(long)in_stack_fffffffffffffed8,iVar12,
                       in_stack_fffffffffffffec8,iVar13,in_stack_ffffffffffffff00,
                       (double)in_stack_fffffffffffffeb8,(double)in_stack_fffffffffffffeb0,
                       (int *)ngoodpix,
                       (int *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
            iVar12 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
          }
          else if (in_EDX == 0xc) {
            pdVar8 = (double *)&stack0xffffffffffffff7c;
            lVar15 = CONCAT44(uVar7,iVar18);
            imcomp_convert_tile_tsbyte
                      ((fitsfile *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       in_stack_fffffffffffffee0,(long)in_stack_fffffffffffffed8,iVar12,
                       in_stack_fffffffffffffec8,iVar13,in_stack_ffffffffffffff00,
                       (double)in_stack_fffffffffffffeb8,(double)in_stack_fffffffffffffeb0,
                       (int *)ngoodpix,
                       (int *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
            iVar12 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
          }
          else if (in_EDX == 0x1f) {
            pdVar8 = (double *)&stack0xffffffffffffff7c;
            lVar15 = CONCAT44(uVar7,iVar18);
            imcomp_convert_tile_tint
                      ((fitsfile *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       in_stack_fffffffffffffee0,(long)in_stack_fffffffffffffed8,iVar12,
                       in_stack_fffffffffffffec8,iVar13,in_stack_ffffffffffffff00,
                       (double)in_stack_fffffffffffffeb8,(double)in_stack_fffffffffffffeb0,
                       (int *)ngoodpix,
                       (int *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
            iVar12 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
          }
          else if (in_EDX == 0x1e) {
            pdVar8 = (double *)&stack0xffffffffffffff7c;
            lVar15 = CONCAT44(uVar7,iVar18);
            imcomp_convert_tile_tuint
                      ((fitsfile *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       in_stack_fffffffffffffee0,(long)in_stack_fffffffffffffed8,iVar12,
                       in_stack_fffffffffffffec8,iVar13,in_stack_ffffffffffffff00,
                       (double)in_stack_fffffffffffffeb8,(double)in_stack_fffffffffffffeb0,
                       (int *)ngoodpix,
                       (int *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
            iVar12 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
          }
          else {
            if (in_EDX == 0x29) {
              ffpmsg((char *)0x1ec0b3);
              *(int *)in_stack_00000020 = 0x19a;
              return 0x19a;
            }
            if (in_EDX == 0x28) {
              ffpmsg((char *)0x1ec0e7);
              *(int *)in_stack_00000020 = 0x19a;
              return 0x19a;
            }
            uVar10 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
            uVar11 = (undefined4)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
            pdVar8 = in_stack_00000018;
            in_stack_fffffffffffffed8 = in_stack_00000020;
            if (in_EDX == 0x2a) {
              in_stack_fffffffffffffec8 = (fitsfile *)&stack0xffffffffffffff08;
              in_stack_fffffffffffffed0 = (int *)&stack0xffffffffffffff00;
              in_stack_fffffffffffffeb8 = (LONGLONG *)&stack0xffffffffffffff7c;
              in_stack_fffffffffffffec0 = (fitsfile *)&stack0xffffffffffffff80;
              lVar15 = CONCAT44(uVar7,in_stack_00000010);
              plVar9 = (long *)CONCAT44(uVar10,uVar17);
              in_stack_fffffffffffffeb0 = (int *)CONCAT44(uVar11,iVar18);
              imcomp_convert_tile_tfloat
                        (outfptr_00,CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (void *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (long)in_stack_ffffffffffffff18,
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),(int)mean,
                         sigma,(int)noise1,in_stack_ffffffffffffff78,(double)ngoodpix,
                         (double)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         (int *)CONCAT44(uVar17,iVar16),(int *)CONCAT44(iVar19,iVar18),in_RCX,in_R9,
                         in_R8);
              iVar12 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
            }
            else {
              if (in_EDX != 0x52) {
                ffpmsg((char *)0x1ec29a);
                *(int *)in_stack_00000020 = 0x19a;
                return 0x19a;
              }
              in_stack_fffffffffffffec8 = (fitsfile *)&stack0xffffffffffffff08;
              in_stack_fffffffffffffed0 = (int *)&stack0xffffffffffffff00;
              in_stack_fffffffffffffeb8 = (LONGLONG *)&stack0xffffffffffffff7c;
              in_stack_fffffffffffffec0 = (fitsfile *)&stack0xffffffffffffff80;
              lVar15 = CONCAT44(uVar7,in_stack_00000010);
              plVar9 = (long *)CONCAT44(uVar10,uVar17);
              in_stack_fffffffffffffeb0 = (int *)CONCAT44(uVar11,iVar18);
              imcomp_convert_tile_tdouble
                        (outfptr_00,CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (void *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (long)in_stack_ffffffffffffff18,
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),(int)mean,
                         sigma,(int)noise1,in_stack_ffffffffffffff78,(double)ngoodpix,
                         (double)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         (int *)CONCAT44(uVar17,iVar16),(int *)CONCAT44(iVar19,iVar18),in_RCX,in_R9,
                         in_R8);
              iVar12 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
            }
          }
        }
        if ((int)*in_stack_00000020 < 1) {
          if (iVar16 == 0) {
            if (*(int *)(*(long *)(in_RDI + 8) + 0x4e0) < 1) {
              iVar16 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
              if (*(int *)(*(long *)(in_RDI + 8) + 0x430) == 0) {
                fficol(in_stack_fffffffffffffec0,iVar16,(char *)in_stack_fffffffffffffeb0,
                       (char *)plVar9,(int *)pdVar8);
              }
              else {
                fficol(in_stack_fffffffffffffec0,iVar16,(char *)in_stack_fffffffffffffeb0,
                       (char *)plVar9,(int *)pdVar8);
              }
              if ((int)*in_stack_00000020 < 1) {
                ffgcno((fitsfile *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       iVar12,in_stack_fffffffffffffef0,
                       (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       in_stack_fffffffffffffee0);
              }
            }
            if (in_EDX == 0x2a) {
              lVar2 = (long)in_R8 << 2;
              auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
              auVar5._0_8_ = lVar2;
              auVar5._12_4_ = 0x45300000;
              dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * 1.1;
              uVar3 = (ulong)dVar4;
              inmemptr = (char *)calloc(uVar3 | (long)(dVar4 - 9.223372036854776e+18) &
                                                (long)uVar3 >> 0x3f,1);
              if (inmemptr == (char *)0x0) {
                ffpmsg((char *)0x1ecf85);
                *(undefined4 *)in_stack_00000020 = 0x71;
                return 0x71;
              }
              if (in_stack_00000010 == 1) {
                imcomp_float2nan((float *)in_RCX,(long)in_R8,(int *)in_RCX,
                                 *(float *)in_stack_00000018,(int *)in_stack_00000020);
              }
              ffswap4((int *)pdVar8,lVar15);
              compress2mem_from_mem
                        (inmemptr,CONCAT44(uVar14,in_stack_ffffffffffffff40),(char **)outfptr_00,
                         (size_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (_func_void_ptr_void_ptr_size_t *)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (size_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (int *)mean);
            }
            else {
              lVar2 = (long)in_R8 << 3;
              auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
              auVar6._0_8_ = lVar2;
              auVar6._12_4_ = 0x45300000;
              dVar4 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * 1.1;
              uVar3 = (ulong)dVar4;
              inmemptr = (char *)calloc(uVar3 | (long)(dVar4 - 9.223372036854776e+18) &
                                                (long)uVar3 >> 0x3f,1);
              if (inmemptr == (char *)0x0) {
                ffpmsg((char *)0x1ed0da);
                *(undefined4 *)in_stack_00000020 = 0x71;
                return 0x71;
              }
              if (in_stack_00000010 == 1) {
                imcomp_double2nan(in_RCX,(long)in_R8,(LONGLONG *)in_RCX,*in_stack_00000018,
                                  (int *)in_stack_00000020);
              }
              ffswap8(pdVar8,lVar15);
              compress2mem_from_mem
                        (inmemptr,CONCAT44(uVar14,in_stack_ffffffffffffff40),(char **)outfptr_00,
                         (size_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (_func_void_ptr_void_ptr_size_t *)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (size_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (int *)mean);
            }
            ffpclb(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                   CONCAT44(in_stack_00007144,in_stack_00007140),in_stack_00007138,in_stack_00007130
                   ,in_stack_000071a0);
            free(inmemptr);
          }
          else {
            minvalue = *(int **)(*(long *)(in_RDI + 8) + 0x4d0);
            lldst = (short *)calloc((size_t)minvalue,1);
            if (lldst == (short *)0x0) {
              ffpmsg((char *)0x1ec347);
              *(int *)in_stack_00000020 = 0x71;
              return 0x71;
            }
            if (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0xb) {
              if (in_stack_ffffffffffffff7c == 2) {
                iVar16 = fits_rcomp_short((short *)outfptr_00,in_stack_ffffffffffffff34,
                                          (uchar *)CONCAT44(in_stack_ffffffffffffff2c,
                                                            in_stack_ffffffffffffff28),
                                          in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
              }
              else if (in_stack_ffffffffffffff7c == 1) {
                iVar16 = fits_rcomp_byte((char *)outfptr_00,in_stack_ffffffffffffff34,
                                         (uchar *)CONCAT44(in_stack_ffffffffffffff2c,
                                                           in_stack_ffffffffffffff28),
                                         in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
              }
              else {
                iVar16 = fits_rcomp(&outfptr_00->HDUposition,in_stack_ffffffffffffff34,
                                    (uchar *)CONCAT44(in_stack_ffffffffffffff2c,
                                                      in_stack_ffffffffffffff28),
                                    in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
              }
              if (iVar16 < 0) {
                free(lldst);
                ffpmsg((char *)0x1ec487);
                *(int *)in_stack_00000020 = 0x19d;
                return 0x19d;
              }
              ffpclb(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                     CONCAT44(in_stack_00007144,in_stack_00007140),in_stack_00007138,
                     in_stack_00007130,in_stack_000071a0);
            }
            else if (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x1f) {
              for (lVar15 = 0; lVar15 < (long)in_R8; lVar15 = lVar15 + 1) {
                if ((*(int *)((long)pdVar20 + lVar15 * 4) < 0) ||
                   (0xffffff < *(int *)((long)pdVar20 + lVar15 * 4))) {
                  ffpmsg((char *)0x1ec564);
                  *(int *)in_stack_00000020 = 0x19d;
                  return 0x19d;
                }
              }
              iVar16 = pl_p2li((int *)pdVar20,1,lldst,(int)in_R8);
              if (iVar16 < 0) {
                free(lldst);
                ffpmsg((char *)0x1ec5eb);
                *(int *)in_stack_00000020 = 0x19d;
                return 0x19d;
              }
              ffpcli(in_stack_00007148,in_stack_00007144,in_stack_00007138,
                     (LONGLONG)in_stack_00007130,in_stack_00007128,(short *)in_stack_00007120,
                     in_stack_00007190);
            }
            else if ((*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x15) ||
                    (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x16)) {
              fVar1 = *(float *)(*(long *)(in_RDI + 8) + 0x470);
              if ((fVar1 != 9999.0) || ((NAN(fVar1) || (in_EDX != 0x2a)))) {
                fVar1 = *(float *)(*(long *)(in_RDI + 8) + 0x470);
                if ((fVar1 != 9999.0) || ((NAN(fVar1) || (in_EDX != 0x52)))) {
                  if (in_stack_ffffffffffffff7c == 2) {
                    ffswap2((short *)in_stack_fffffffffffffeb0,(long)plVar9);
                  }
                  else if (in_stack_ffffffffffffff7c == 4) {
                    ffswap4((int *)pdVar8,lVar15);
                  }
                  if (in_stack_ffffffffffffff7c == 2) {
                    if (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x16) {
                      fits_shuffle_2bytes((char *)in_stack_fffffffffffffec0,
                                          (LONGLONG)in_stack_fffffffffffffeb8,
                                          in_stack_fffffffffffffeb0);
                    }
                    compress2mem_from_mem
                              ((char *)lldst,CONCAT44(uVar14,in_stack_ffffffffffffff40),
                               (char **)outfptr_00,
                               (size_t *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               (_func_void_ptr_void_ptr_size_t *)
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                               (size_t *)
                               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                               (int *)mean);
                  }
                  else if (in_stack_ffffffffffffff7c == 1) {
                    compress2mem_from_mem
                              ((char *)lldst,CONCAT44(uVar14,in_stack_ffffffffffffff40),
                               (char **)outfptr_00,
                               (size_t *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               (_func_void_ptr_void_ptr_size_t *)
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                               (size_t *)
                               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                               (int *)mean);
                  }
                  else {
                    if (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x16) {
                      fits_shuffle_4bytes((char *)in_stack_fffffffffffffec8,
                                          (LONGLONG)in_stack_fffffffffffffec0,
                                          (int *)in_stack_fffffffffffffeb8);
                    }
                    compress2mem_from_mem
                              ((char *)lldst,CONCAT44(uVar14,in_stack_ffffffffffffff40),
                               (char **)outfptr_00,
                               (size_t *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               (_func_void_ptr_void_ptr_size_t *)
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                               (size_t *)
                               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                               (int *)mean);
                  }
                }
                else {
                  ffswap8(pdVar8,lVar15);
                  if (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x16) {
                    fits_shuffle_8bytes((char *)in_stack_fffffffffffffec0,
                                        (LONGLONG)in_stack_fffffffffffffeb8,
                                        in_stack_fffffffffffffeb0);
                  }
                  compress2mem_from_mem
                            ((char *)lldst,CONCAT44(uVar14,in_stack_ffffffffffffff40),
                             (char **)outfptr_00,
                             (size_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                             ,(_func_void_ptr_void_ptr_size_t *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                             (size_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                             ,(int *)mean);
                }
              }
              else {
                ffswap4((int *)pdVar8,lVar15);
                if (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x16) {
                  fits_shuffle_4bytes((char *)in_stack_fffffffffffffec8,
                                      (LONGLONG)in_stack_fffffffffffffec0,
                                      (int *)in_stack_fffffffffffffeb8);
                }
                compress2mem_from_mem
                          ((char *)lldst,CONCAT44(uVar14,in_stack_ffffffffffffff40),
                           (char **)outfptr_00,
                           (size_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           (_func_void_ptr_void_ptr_size_t *)
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           (size_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           (int *)mean);
              }
              ffpclb(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                     CONCAT44(in_stack_00007144,in_stack_00007140),in_stack_00007138,
                     in_stack_00007130,in_stack_000071a0);
            }
            else {
              if (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x33) {
                if (in_stack_ffffffffffffff7c == 2) {
                  ffswap2((short *)in_stack_fffffffffffffeb0,(long)plVar9);
                }
                else if (in_stack_ffffffffffffff7c == 4) {
                  ffswap4((int *)pdVar8,lVar15);
                }
                ffpmsg((char *)0x1eca67);
                *(int *)in_stack_00000020 = 0x19d;
                return 0x19d;
              }
              if (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x29) {
                fVar1 = *(float *)(*(long *)(in_RDI + 8) + 0x524);
                if (0.0 < fVar1) {
                  in_stack_fffffffffffffec8 = (fitsfile *)&stack0xffffffffffffff18;
                  in_stack_fffffffffffffed0 = (int *)&stack0xffffffffffffff10;
                  pdVar8 = (double *)0x0;
                  plVar9 = (long *)0x0;
                  in_stack_fffffffffffffeb0 = (int *)0x0;
                  in_stack_fffffffffffffeb8 = (LONGLONG *)0x0;
                  in_stack_fffffffffffffed8 = in_stack_00000020;
                  fits_img_stats_int((int *)CONCAT44(fVar1,in_stack_ffffffffffffff28),
                                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                     (long)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                                     in_stack_ffffffffffffff10,ngoodpix,minvalue,
                                     in_stack_ffffffffffffff58,mean,sigma,noise1,
                                     (double *)
                                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                     (double *)CONCAT44(uVar17,iVar16),
                                     (double *)CONCAT44(iVar19,iVar18),(int *)pdVar20);
                }
                iVar16 = (int)((ulong)plVar9 >> 0x20);
                if ((iVar18 == 8) || (iVar18 == 0x10)) {
                  fits_hcompress((int *)in_stack_fffffffffffffeb8,
                                 (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                                 (int)in_stack_fffffffffffffeb0,iVar16,(char *)pdVar8,
                                 in_stack_00000020,in_stack_fffffffffffffed0);
                }
                else {
                  fits_int_to_longlong_inplace
                            ((int *)in_stack_fffffffffffffed8,(long)in_stack_fffffffffffffed0,
                             &in_stack_fffffffffffffec8->HDUposition);
                  fits_hcompress64(in_stack_fffffffffffffeb8,
                                   (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                                   (int)in_stack_fffffffffffffeb0,iVar16,(char *)pdVar8,
                                   in_stack_00000020,in_stack_fffffffffffffed0);
                }
                ffpclb(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                       CONCAT44(in_stack_00007144,in_stack_00007140),in_stack_00007138,
                       in_stack_00007130,in_stack_000071a0);
              }
            }
            if (0 < *(int *)(*(long *)(in_RDI + 8) + 0x4e4)) {
              ffpcld(in_stack_00007148,in_stack_00007144,in_stack_00007138,
                     (LONGLONG)in_stack_00007130,in_stack_00007128,in_stack_00007120,
                     in_stack_00007190);
              ffpcld(in_stack_00007148,in_stack_00007144,in_stack_00007138,
                     (LONGLONG)in_stack_00007130,in_stack_00007128,in_stack_00007120,
                     in_stack_00007190);
            }
            free(lldst);
          }
          local_34 = (int)*in_stack_00000020;
        }
        else {
          local_34 = (int)*in_stack_00000020;
        }
      }
    }
    else {
      ffpmsg((char *)0x1eba2f);
      *(int *)in_stack_00000020 = 0x19d;
      local_34 = 0x19d;
    }
  }
  else {
    local_34 = (int)*in_stack_00000020;
  }
  return local_34;
}

Assistant:

int imcomp_compress_tile (fitsfile *outfptr,
    long row,  /* tile number = row in the binary table that holds the compressed data */
    int datatype, 
    void *tiledata, 
    long tilelen,
    long tilenx,
    long tileny,
    int nullcheck,
    void *nullflagval,
    int *status)

/*
   This is the main compression routine.

   This routine does the following to the input tile of pixels:
        - if it is a float or double image, then it quantizes the pixels
        - compresses the integer pixel values
        - writes the compressed byte stream to the FITS file.

   If the tile cannot be quantized than the raw float or double values
   are losslessly compressed with gzip and then written to the output table.
   
   This input array may be modified by this routine.  If the array is of type TINT
   or TFLOAT, and the compression type is HCOMPRESS, then it must have been 
   allocated to be twice as large (8 bytes per pixel) to provide scratch space.

  Note that this routine does not fully support the implicit datatype conversion that
  is supported when writing to normal FITS images.  The datatype of the input array
  must have the same datatype (either signed or unsigned) as the output (compressed)
  FITS image in some cases.
*/
{
    int *idata;		/* quantized integer data */
    int cn_zblank, zbitpix, nullval;
    int flag = 1;  /* true by default; only = 0 if float data couldn't be quantized */
    int intlength;      /* size of integers to be compressed */
    double scale, zero, actual_bzero;
    long ii;
    size_t clen;		/* size of cbuf */
    short *cbuf;	/* compressed data */
    int  nelem = 0;		/* number of bytes */
    int tilecol;
    size_t gzip_nelem = 0;
    unsigned int bzlen;
    int ihcompscale;
    float hcompscale;
    double noise2, noise3, noise5;
    double bscale[1] = {1.}, bzero[1] = {0.};	/* scaling parameters */
    long  hcomp_len;
    LONGLONG *lldata;

    if (*status > 0)
        return(*status);

    /* check for special case of losslessly compressing floating point */
    /* images.  Only compression algorithm that supports this is GZIP */
    if ( (outfptr->Fptr)->quantize_level == NO_QUANTIZE) {
       if (((outfptr->Fptr)->compress_type != GZIP_1) &&
           ((outfptr->Fptr)->compress_type != GZIP_2)) {
           switch (datatype) {
            case TFLOAT:
            case TDOUBLE:
            case TCOMPLEX:
            case TDBLCOMPLEX:
              ffpmsg("Lossless compression of floating point images must use GZIP (imcomp_compress_tile)");
              return(*status = DATA_COMPRESSION_ERR);
            default:
              break;
          }
       }
    }

    /* free the previously saved tile if the input tile is for the same row */
    if ((outfptr->Fptr)->tilerow) {  /* has the tile cache been allocated? */

      /* calculate the column bin of the compressed tile */
      tilecol = (row - 1) % ((long)(((outfptr->Fptr)->znaxis[0] - 1) / ((outfptr->Fptr)->tilesize[0])) + 1);
      
      if ((outfptr->Fptr)->tilerow[tilecol] == row) {
        if (((outfptr->Fptr)->tiledata)[tilecol]) {
            free(((outfptr->Fptr)->tiledata)[tilecol]);
        }
	  
        if (((outfptr->Fptr)->tilenullarray)[tilecol]) {
            free(((outfptr->Fptr)->tilenullarray)[tilecol]);
        }

        ((outfptr->Fptr)->tiledata)[tilecol] = 0;
        ((outfptr->Fptr)->tilenullarray)[tilecol] = 0;
        (outfptr->Fptr)->tilerow[tilecol] = 0;
        (outfptr->Fptr)->tiledatasize[tilecol] = 0;
        (outfptr->Fptr)->tiletype[tilecol] = 0;
        (outfptr->Fptr)->tileanynull[tilecol] = 0;
      }
    }

    if ( (outfptr->Fptr)->compress_type == NOCOMPRESS) {
         /* Special case when using NOCOMPRESS for diagnostic purposes in fpack */
         if (imcomp_write_nocompress_tile(outfptr, row, datatype, tiledata, tilelen, 
	     nullcheck, nullflagval, status) > 0) {
             return(*status);
         }
         return(*status);
    }

    /* =========================================================================== */
    /* initialize various parameters */
    idata = (int *) tiledata;   /* may overwrite the input tiledata in place */

    /* zbitpix is the BITPIX keyword value in the uncompressed FITS image */
    zbitpix = (outfptr->Fptr)->zbitpix;

    /* if the tile/image has an integer datatype, see if a null value has */
    /* been defined (with the BLANK keyword in a normal FITS image).  */
    /* If so, and if the input tile array also contains null pixels, */
    /* (represented by pixels that have a value = nullflagval) then  */
    /* any pixels whose value = nullflagval, must be set to the value = nullval */
    /* before the pixel array is compressed.  These null pixel values must */
    /* not be inverse scaled by the BSCALE/BZERO values, if present. */

    cn_zblank = (outfptr->Fptr)->cn_zblank;
    nullval = (outfptr->Fptr)->zblank;

    if (zbitpix > 0 && cn_zblank != -1)  /* If the integer image has no defined null */
        nullcheck = 0;    /* value, then don't bother checking input array for nulls. */

    /* if the BSCALE and BZERO keywords exist, then the input values must */
    /* be inverse scaled by this factor, before the values are compressed. */
    /* (The program may have turned off scaling, which over rides the keywords) */
    
    scale = (outfptr->Fptr)->cn_bscale;
    zero  = (outfptr->Fptr)->cn_bzero;
    actual_bzero = (outfptr->Fptr)->cn_actual_bzero;

    /* =========================================================================== */
    /* prepare the tile of pixel values for compression */
    if (datatype == TSHORT) {
       imcomp_convert_tile_tshort(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, actual_bzero, &intlength, status);
    } else if (datatype == TUSHORT) {
       imcomp_convert_tile_tushort(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, &intlength, status);
    } else if (datatype == TBYTE) {
       imcomp_convert_tile_tbyte(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero,  &intlength, status);
    } else if (datatype == TSBYTE) {
       imcomp_convert_tile_tsbyte(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero,  &intlength, status);
    } else if (datatype == TINT) {
       imcomp_convert_tile_tint(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, &intlength, status);
    } else if (datatype == TUINT) {
       imcomp_convert_tile_tuint(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, &intlength, status);
    } else if (datatype == TLONG && sizeof(long) == 8) {
           ffpmsg("Integer*8 Long datatype is not supported when writing to compressed images");
           return(*status = BAD_DATATYPE);
    } else if (datatype == TULONG && sizeof(long) == 8) {
           ffpmsg("Unsigned integer*8 datatype is not supported when writing to compressed images");
           return(*status = BAD_DATATYPE);
    } else if (datatype == TFLOAT) {
        imcomp_convert_tile_tfloat(outfptr, row, tiledata, tilelen, tilenx, tileny, nullcheck,
        nullflagval, nullval, zbitpix, scale, zero, &intlength, &flag, bscale, bzero, status);
    } else if (datatype == TDOUBLE) {
       imcomp_convert_tile_tdouble(outfptr, row, tiledata, tilelen, tilenx, tileny, nullcheck,
       nullflagval, nullval, zbitpix, scale, zero, &intlength, &flag, bscale, bzero, status);
    } else {
          ffpmsg("unsupported image datatype (imcomp_compress_tile)");
          return(*status = BAD_DATATYPE);
    }

    if (*status > 0)
      return(*status);      /* return if error occurs */

    /* =========================================================================== */
    if (flag)   /* now compress the integer data array */
    {
        /* allocate buffer for the compressed tile bytes */
        clen = (outfptr->Fptr)->maxelem;
        cbuf = (short *) calloc (clen, sizeof (unsigned char));

        if (cbuf == NULL) {
            ffpmsg("Memory allocation failure. (imcomp_compress_tile)");
	    return (*status = MEMORY_ALLOCATION);
        }

        /* =========================================================================== */
        if ( (outfptr->Fptr)->compress_type == RICE_1)
        {
            if (intlength == 2) {
  	        nelem = fits_rcomp_short ((short *)idata, tilelen, (unsigned char *) cbuf,
                       clen, (outfptr->Fptr)->rice_blocksize);
            } else if (intlength == 1) {
  	        nelem = fits_rcomp_byte ((signed char *)idata, tilelen, (unsigned char *) cbuf,
                       clen, (outfptr->Fptr)->rice_blocksize);
            } else {
  	        nelem = fits_rcomp (idata, tilelen, (unsigned char *) cbuf,
                       clen, (outfptr->Fptr)->rice_blocksize);
            }

	    if (nelem < 0)  /* data compression error condition */
            {
	        free (cbuf);
                ffpmsg("error Rice compressing image tile (imcomp_compress_tile)");
                return (*status = DATA_COMPRESSION_ERR);
            }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     nelem, (unsigned char *) cbuf, status);
        }

        /* =========================================================================== */
        else if ( (outfptr->Fptr)->compress_type == PLIO_1)
        {
              for (ii = 0; ii < tilelen; ii++)  {
                if (idata[ii] < 0 || idata[ii] > 16777215)
                {
                   /* plio algorithn only supports positive 24 bit ints */
                   ffpmsg("data out of range for PLIO compression (0 - 2**24)");
                   return(*status = DATA_COMPRESSION_ERR);
                }
              }

  	      nelem = pl_p2li (idata, 1, cbuf, tilelen);

	      if (nelem < 0)  /* data compression error condition */
              {
	        free (cbuf);
                ffpmsg("error PLIO compressing image tile (imcomp_compress_tile)");
                return (*status = DATA_COMPRESSION_ERR);
              }

	      /* Write the compressed byte stream. */
              ffpcli(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     nelem, cbuf, status);
        }

        /* =========================================================================== */
        else if ( ((outfptr->Fptr)->compress_type == GZIP_1) ||
                  ((outfptr->Fptr)->compress_type == GZIP_2) )   {

	    if ((outfptr->Fptr)->quantize_level == NO_QUANTIZE && datatype == TFLOAT) {
	      /* Special case of losslessly compressing floating point pixels with GZIP */
	      /* In this case we compress the input tile array directly */

#if BYTESWAPPED
               ffswap4((int*) tiledata, tilelen); 
#endif
               if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_4bytes((char *) tiledata, tilelen, status);

                compress2mem_from_mem((char *) tiledata, tilelen * sizeof(float),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

	    } else if ((outfptr->Fptr)->quantize_level == NO_QUANTIZE && datatype == TDOUBLE) {
	      /* Special case of losslessly compressing double pixels with GZIP */
	      /* In this case we compress the input tile array directly */

#if BYTESWAPPED
               ffswap8((double *) tiledata, tilelen); 
#endif
               if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_8bytes((char *) tiledata, tilelen, status);

                compress2mem_from_mem((char *) tiledata, tilelen * sizeof(double),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

	    } else {

	        /* compress the integer idata array */

#if BYTESWAPPED
	       if (intlength == 2)
                 ffswap2((short *) idata, tilelen); 
	       else if (intlength == 4)
                 ffswap4(idata, tilelen); 
#endif

               if (intlength == 2) {

                  if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_2bytes((char *) tiledata, tilelen, status);

                  compress2mem_from_mem((char *) idata, tilelen * sizeof(short),
                   (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

               } else if (intlength == 1) {

                  compress2mem_from_mem((char *) idata, tilelen * sizeof(unsigned char),
                   (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

               } else {

                  if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_4bytes((char *) tiledata, tilelen, status);

                  compress2mem_from_mem((char *) idata, tilelen * sizeof(int),
                   (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);
               }
            }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     gzip_nelem, (unsigned char *) cbuf, status);

        /* =========================================================================== */
        } else if ( (outfptr->Fptr)->compress_type == BZIP2_1) {

#if BYTESWAPPED
	   if (intlength == 2)
               ffswap2((short *) idata, tilelen); 
	   else if (intlength == 4)
               ffswap4(idata, tilelen); 
#endif

           bzlen = (unsigned int) clen;
	   
           /* call bzip2 with blocksize = 900K, verbosity = 0, and default workfactor */

/*  bzip2 is not supported in the public release.  This is only for test purposes.
           if (BZ2_bzBuffToBuffCompress( (char *) cbuf, &bzlen,
	         (char *) idata, (unsigned int) (tilelen * intlength), 9, 0, 0) ) 
*/
	   {
                   ffpmsg("bzip2 compression error");
                   return(*status = DATA_COMPRESSION_ERR);
           }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     bzlen, (unsigned char *) cbuf, status);

        /* =========================================================================== */
        }  else if ( (outfptr->Fptr)->compress_type == HCOMPRESS_1)     {
	    /*
	      if hcompscale is positive, then we have to multiply
	      the value by the RMS background noise to get the 
	      absolute scale value.  If negative, then it gives the
	      absolute scale value directly.
	    */
            hcompscale = (outfptr->Fptr)->hcomp_scale;

	    if (hcompscale > 0.) {
	       fits_img_stats_int(idata, tilenx, tileny, nullcheck,
	                nullval, 0,0,0,0,0,0,&noise2,&noise3,&noise5,status);

		/* use the minimum of the 3 noise estimates */
		if (noise2 != 0. && noise2 < noise3) noise3 = noise2;
		if (noise5 != 0. && noise5 < noise3) noise3 = noise5;
		
		hcompscale = (float) (hcompscale * noise3);

	    } else if (hcompscale < 0.) {

		hcompscale = hcompscale * -1.0F;
	    }

	    ihcompscale = (int) (hcompscale + 0.5);

            hcomp_len = clen;  /* allocated size of the buffer */
	    
            if (zbitpix == BYTE_IMG || zbitpix == SHORT_IMG) {
                fits_hcompress(idata, tilenx, tileny, 
		  ihcompscale, (char *) cbuf, &hcomp_len, status);

            } else {
                 /* have to convert idata to an I*8 array, in place */
                 /* idata must have been allocated large enough to do this */

                fits_int_to_longlong_inplace(idata, tilelen, status);
                lldata = (LONGLONG *) idata;		

                fits_hcompress64(lldata, tilenx, tileny, 
		  ihcompscale, (char *) cbuf, &hcomp_len, status);
            }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     hcomp_len, (unsigned char *) cbuf, status);
        }

        /* =========================================================================== */
        if ((outfptr->Fptr)->cn_zscale > 0)
        {
              /* write the linear scaling parameters for this tile */
	      ffpcld (outfptr, (outfptr->Fptr)->cn_zscale, row, 1, 1,
                      bscale, status);
	      ffpcld (outfptr, (outfptr->Fptr)->cn_zzero,  row, 1, 1,
                      bzero,  status);
        }

        free(cbuf);  /* finished with this buffer */

    /* =========================================================================== */
    } else {    /* if flag == 0., floating point data couldn't be quantized */

	 /* losslessly compress the data with gzip. */

         /* if gzip2 compressed data column doesn't exist, create it */
         if ((outfptr->Fptr)->cn_gzip_data < 1) {
              if ( (outfptr->Fptr)->request_huge_hdu != 0) {
                 fits_insert_col(outfptr, 999, "GZIP_COMPRESSED_DATA", "1QB", status);
              } else {
                 fits_insert_col(outfptr, 999, "GZIP_COMPRESSED_DATA", "1PB", status);
              }

                 if (*status <= 0)  /* save the number of this column */
                       ffgcno(outfptr, CASEINSEN, "GZIP_COMPRESSED_DATA",
                                &(outfptr->Fptr)->cn_gzip_data, status);
         }

         if (datatype == TFLOAT)  {
               /* allocate buffer for the compressed tile bytes */
	       /* make it 10% larger than the original uncompressed data */
               clen = (size_t) (tilelen * sizeof(float) * 1.1);
               cbuf = (short *) calloc (clen, sizeof (unsigned char));

               if (cbuf == NULL)
               {
                   ffpmsg("Memory allocation error. (imcomp_compress_tile)");
	           return (*status = MEMORY_ALLOCATION);
               }

	       /* convert null values to NaNs in place, if necessary */
	       if (nullcheck == 1) {
	           imcomp_float2nan((float *) tiledata, tilelen, (int *) tiledata,
	               *(float *) (nullflagval), status);
	       }

#if BYTESWAPPED
               ffswap4((int*) tiledata, tilelen); 
#endif
               compress2mem_from_mem((char *) tiledata, tilelen * sizeof(float),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

         } else {  /* datatype == TDOUBLE */

               /* allocate buffer for the compressed tile bytes */
	       /* make it 10% larger than the original uncompressed data */
               clen = (size_t) (tilelen * sizeof(double) * 1.1);
               cbuf = (short *) calloc (clen, sizeof (unsigned char));

               if (cbuf == NULL)
               {
                   ffpmsg("Memory allocation error. (imcomp_compress_tile)");
	           return (*status = MEMORY_ALLOCATION);
               }

	       /* convert null values to NaNs in place, if necessary */
	       if (nullcheck == 1) {
	           imcomp_double2nan((double *) tiledata, tilelen, (LONGLONG *) tiledata,
	               *(double *) (nullflagval), status);
	       }

#if BYTESWAPPED
               ffswap8((double*) tiledata, tilelen); 
#endif
               compress2mem_from_mem((char *) tiledata, tilelen * sizeof(double),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);
        }

	/* Write the compressed byte stream. */
        ffpclb(outfptr, (outfptr->Fptr)->cn_gzip_data, row, 1,
             gzip_nelem, (unsigned char *) cbuf, status);

        free(cbuf);  /* finished with this buffer */
    }

    return(*status);
}